

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O1

void checkfile(char *inp,permonst *pm,boolean user_typed_name,boolean without_asking)

{
  nh_menuitem *pnVar1;
  ushort uVar2;
  attack aVar3;
  byte bVar4;
  bool bVar5;
  boolean bVar6;
  uchar uVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  size_t sVar14;
  attack *paVar15;
  byte bVar16;
  long lVar17;
  undefined8 uVar18;
  undefined7 in_register_00000011;
  char *text;
  char *text_00;
  char *text_01;
  char *pcVar19;
  char *text_02;
  char *text_03;
  long lVar20;
  dlb *pdVar21;
  byte bVar22;
  permonst *ppVar23;
  char *pcVar24;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  menulist menu;
  int entry_count;
  long txt_offset;
  char buf_1 [256];
  long entry_offset;
  char buf [256];
  char size [256];
  char adjbuf [256];
  char newstr [256];
  char specialadj [256];
  char mnname [256];
  menulist local_9a8;
  undefined4 local_994;
  dlb *local_990;
  permonst *local_988;
  undefined4 local_97c;
  ulong local_978;
  uint local_970;
  int local_96c;
  char *local_968;
  long local_960;
  uint local_954;
  uint local_950;
  undefined4 local_94c;
  char local_948 [8];
  undefined8 uStack_940;
  undefined2 local_938;
  long local_840;
  char local_838 [256];
  int local_738;
  ushort local_734;
  attack local_638 [64];
  undefined8 local_538;
  int local_530;
  char local_528 [240];
  char local_438 [256];
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  local_990 = dlb_fopen("data","r");
  if (local_990 == (dlb *)0x0) {
    pline("Cannot open data file!");
    return;
  }
  local_94c = (undefined4)CONCAT71(in_register_00000011,user_typed_name);
  local_97c = SUB84(pm,0);
  if ((char)pm != '\0') {
    pline("Looking up \"%s\"...",inp);
  }
  strcpy((char *)&local_538,inp);
  lcase((char *)&local_538);
  bVar27 = local_530 != 0x20666f20;
  bVar5 = local_538 != 0x726f697265746e69;
  lVar20 = 0xc;
  if (bVar27 || bVar5) {
    lVar20 = 0;
  }
  pcVar13 = (char *)((long)&local_538 + lVar20);
  lVar20 = 2;
  iVar9 = strncmp(pcVar13,"a ",2);
  if (iVar9 == 0) {
    lVar17 = 0xe;
LAB_0020d7c2:
    if (!bVar27 && !bVar5) {
      lVar20 = lVar17;
    }
    pcVar19 = (char *)((long)&local_538 + lVar20);
  }
  else {
    lVar20 = 3;
    iVar9 = strncmp(pcVar13,"an ",3);
    if (iVar9 == 0) {
      lVar17 = 0xf;
      goto LAB_0020d7c2;
    }
    iVar9 = strncmp(pcVar13,"the ",4);
    pcVar19 = (char *)((long)&local_538 + 4);
    if (!bVar27 && !bVar5) {
      pcVar19 = local_528;
    }
    if (iVar9 != 0) {
      pcVar19 = pcVar13;
    }
  }
  pdVar21 = local_990;
  lVar20 = 5;
  iVar9 = strncmp(pcVar19,"tame ",5);
  if (iVar9 != 0) {
    iVar9 = strncmp(pcVar19,"peaceful ",9);
    lVar20 = (ulong)(iVar9 == 0) * 9;
  }
  pcVar13 = pcVar19 + lVar20;
  iVar9 = strncmp(pcVar13,"invisible ",10);
  pcVar19 = pcVar19 + lVar20 + 10;
  if (iVar9 != 0) {
    pcVar19 = pcVar13;
  }
  iVar10 = strncmp(pcVar19,"statue of ",10);
  if (iVar10 == 0) {
    lVar17 = 0x10;
    lVar20 = 6;
LAB_0020d882:
    if (iVar9 == 0) {
      lVar20 = lVar17;
    }
    pcVar13[lVar20] = '\0';
  }
  else {
    iVar10 = strncmp(pcVar19,"figurine of ",0xc);
    if (iVar10 == 0) {
      lVar17 = 0x12;
      lVar20 = 8;
      goto LAB_0020d882;
    }
  }
  if (*pcVar19 != '\0') {
    pcVar13 = strstri(pcVar19," [seen");
    if ((pcVar13 != (char *)0x0) || (pcVar13 = strstri(pcVar19," and more"), pcVar13 != (char *)0x0)
       ) {
      *pcVar13 = '\0';
    }
    pcVar13 = strstri(pcVar19," named ");
    if (pcVar13 == (char *)0x0) {
      pcVar13 = strstri(pcVar19," called ");
      pcVar24 = (char *)0x0;
    }
    else {
      pcVar24 = pcVar13 + 7;
    }
    if (pcVar13 == (char *)0x0) {
      pcVar13 = strstri(pcVar19,", ");
    }
    if (pcVar19 < pcVar13) {
      *pcVar13 = '\0';
    }
    if (pcVar24 == (char *)0x0) {
      pcVar24 = makesingular(pcVar19);
    }
    else if ((char)local_97c != '\0') {
      lcase(pcVar24);
    }
    local_960 = 0;
    pcVar13 = dlb_fgets(local_838,0x100,pdVar21);
    if ((pcVar13 == (char *)0x0) ||
       (pcVar13 = dlb_fgets(local_838,0x100,pdVar21), pcVar13 == (char *)0x0)) {
      local_994 = 0;
      impossible("can\'t read \'data\' file");
      dlb_fclose(pdVar21);
      iVar9 = 1;
    }
    else {
      iVar10 = __isoc99_sscanf(local_838,"%8lx\n",&local_960);
      iVar9 = 2;
      if (iVar10 < 1) {
        local_994 = 0;
      }
      else if (local_960 < 1) {
        local_994 = 0;
      }
      else {
        pcVar13 = dlb_fgets(local_838,0x100,pdVar21);
        local_994 = 0;
        iVar9 = 0;
        if (local_838[0] != '.' && pcVar13 != (char *)0x0) {
          bVar27 = false;
          do {
            bVar6 = digit(local_838[0]);
            local_994 = 0;
            bVar5 = false;
            if ((bVar6 == '\0') && (bVar5 = true, !bVar27)) {
              pcVar13 = strchr(local_838,10);
              cVar8 = local_838[0];
              if (pcVar13 == (char *)0x0) {
                local_994 = 0;
                iVar9 = 2;
                break;
              }
              *pcVar13 = '\0';
              bVar27 = local_838[0] == '~';
              bVar6 = pmatch(local_838 + bVar27,pcVar19);
              pdVar21 = local_990;
              if (bVar6 == '\0') {
                iVar9 = 0;
                if (pcVar24 == (char *)0x0) {
                  bVar5 = false;
                }
                else {
                  bVar6 = pmatch(local_838 + bVar27,pcVar24);
                  pdVar21 = local_990;
                  bVar5 = bVar6 != '\0';
                  if (bVar6 != '\0' && cVar8 != '~') {
                    local_994 = (undefined4)CONCAT71(extraout_var_00,1);
                    break;
                  }
                }
              }
              else {
                bVar5 = true;
                if (cVar8 != '~') {
                  iVar9 = 0;
                  local_994 = (undefined4)CONCAT71(extraout_var,1);
                  break;
                }
              }
            }
            bVar27 = bVar5;
            pcVar13 = dlb_fgets(local_838,0x100,pdVar21);
            if (pcVar13 == (char *)0x0) {
              iVar9 = 0;
              break;
            }
            iVar9 = 0;
          } while (local_838[0] != '.');
        }
      }
    }
    if (iVar9 != 2) {
      if (iVar9 != 0) {
        return;
      }
      goto LAB_0020db17;
    }
    goto LAB_0020efd2;
  }
  local_994 = 0;
LAB_0020db17:
  init_menulist(&local_9a8);
  uVar11 = name_to_mon(pcVar19);
  local_968 = pcVar19;
  if ((int)uVar11 < 0) goto LAB_0020ef70;
  ppVar23 = mons + uVar11;
  pcVar13 = mons_mname(ppVar23);
  strcpy(local_138,pcVar13);
  lcase(local_138);
  iVar9 = strcmp(pcVar19,local_138);
  if (iVar9 != 0) goto LAB_0020ef70;
  pcVar13 = mons_mname(ppVar23);
  local_968 = (char *)&local_538;
  strcpy(local_968,pcVar13);
  iVar9 = monsndx(ppVar23);
  sprintf(local_238,"Difficulty %d, AC %d, magic resistance %d.",(ulong)(uint)monstr[iVar9],
          (ulong)(uint)(int)mons[uVar11].ac);
  lVar20 = (long)local_9a8.size;
  if (local_9a8.size <= local_9a8.icount) {
    local_9a8.size = local_9a8.size * 2;
    local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
  }
  pnVar1 = local_9a8.items + local_9a8.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_238);
  local_9a8.icount = local_9a8.icount + 1;
  cVar8 = mons[uVar11].mmove;
  local_988 = ppVar23;
  sprintf(local_948,"Speed %d (",(ulong)(uint)(int)cVar8);
  if (cVar8 < 0x24) {
    if (cVar8 < '\x14') {
      if (cVar8 < '\r') {
        if (cVar8 == '\f') {
          pcVar13 = "normal speed";
        }
        else if (cVar8 < '\t') {
          if (cVar8 < '\x03') {
            pcVar13 = "sessile";
            if ('\0' < cVar8) {
              pcVar13 = "extremely slow";
            }
          }
          else {
            pcVar13 = "very slow";
          }
        }
        else {
          pcVar13 = "slow";
        }
      }
      else {
        pcVar13 = "fast";
      }
    }
    else {
      pcVar13 = "very fast";
    }
  }
  else {
    pcVar13 = "extremely fast";
  }
  strcat(local_948,pcVar13);
  sVar14 = strlen(local_948);
  ppVar23 = local_988;
  (local_948 + sVar14)[0] = ')';
  (local_948 + sVar14)[1] = '.';
  local_948[sVar14 + 2] = '\0';
  lVar20 = (long)local_9a8.size;
  if (local_9a8.size <= local_9a8.icount) {
    local_9a8.size = local_9a8.size * 2;
    local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
  }
  pnVar1 = local_9a8.items + local_9a8.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,local_948);
  local_9a8.icount = local_9a8.icount + 1;
  uVar2 = ppVar23->geno;
  uVar12 = (uint)uVar2;
  memset(local_948,0,0x100);
  bVar22 = (byte)(uVar2 >> 8);
  if ((uVar2 >> 9 & 1) == 0) {
    builtin_strncpy(local_948,"Normally",8);
    uStack_940._0_1_ = ' ';
    uStack_940._1_1_ = 'a';
    uStack_940._2_1_ = 'p';
    uStack_940._3_1_ = 'p';
    uStack_940._4_1_ = 'e';
    uStack_940._5_1_ = 'a';
    uStack_940._6_1_ = 'r';
    uStack_940._7_1_ = 's';
    local_938 = 0x20;
    bVar27 = (uVar2 & 0xc00) == 0;
    if (bVar27) {
      pcVar13 = eos(local_948);
      sprintf(pcVar13,"%s%s","","everywhere");
    }
    iVar9 = appendc(local_948,bVar22 >> 3 & 1,"outside of Gehennom",(uint)bVar27);
    iVar9 = appendc(local_948,bVar22 >> 2 & 1,"in Gehennom",iVar9);
  }
  else {
    pcVar13 = eos(local_948);
    sprintf(pcVar13,"%s%s","","Specially generated");
    iVar9 = 1;
  }
  iVar9 = appendc(local_948,bVar22 >> 4 & 1,"unique",iVar9);
  ppVar23 = local_988;
  bVar22 = (byte)uVar2;
  if ((uVar2 & 0xc0) != 0) {
    if ((char)bVar22 < '\0') {
      pcVar13 = eos(local_948);
      sprintf(pcVar13,"%s%s",""," in groups");
    }
    iVar9 = appendc(local_948,bVar22 >> 6 & 1," in large groups",(uint)((char)bVar22 < '\0'));
  }
  if ((uVar2 >> 9 & 1) != 0) goto LAB_0020e016;
  if (iVar9 != 0) {
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ',';
    (local_948 + sVar14)[1] = ' ';
    local_948[sVar14 + 2] = '\0';
  }
  switch(uVar12 & 7) {
  case 0:
    pcVar13 = eos(local_948);
    sprintf(pcVar13," frequency %d",0);
    break;
  case 1:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"very rar",8);
    *(undefined2 *)((long)&uStack_940 + sVar14) = 0x65;
    break;
  case 2:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"quite rare",0xb);
    break;
  case 3:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"rare",5);
    break;
  case 4:
    sVar14 = strlen(local_948);
    uVar18 = 0x6e6f6d6d6f636e75;
    goto LAB_0020dfab;
  case 5:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"common",7);
    break;
  case 6:
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14,"very com",8);
    *(undefined4 *)((long)&uStack_940 + sVar14) = 0x6e6f6d;
    break;
  case 7:
    sVar14 = strlen(local_948);
    uVar18 = 0x636966696c6f7270;
LAB_0020dfab:
    *(undefined8 *)(local_948 + sVar14) = uVar18;
    *(undefined1 *)((long)&uStack_940 + sVar14) = 0;
  }
LAB_0020e016:
  sVar14 = strlen(local_948);
  (local_948 + sVar14)[0] = '.';
  (local_948 + sVar14)[1] = '\0';
  add_menutext_wrapped(&local_9a8,(int)local_948,text);
  bVar6 = is_unknown_dragon(ppVar23);
  if (bVar6 == '\0') {
    builtin_strncpy(local_948,"Resists ",8);
    uStack_940 = uStack_940 & 0xffffffffffffff00;
    iVar9 = mondesc_resist_flags_to_str(local_948,ppVar23->mresists);
    if (iVar9 == 0) {
      lVar20 = (long)local_9a8.size;
      if (local_9a8.size <= local_9a8.icount) {
        local_9a8.size = local_9a8.size * 2;
        local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_9a8.icount;
      local_9a8.items[lVar20].id = 0;
      local_9a8.items[lVar20].role = MI_TEXT;
      local_9a8.items[lVar20].accel = '\0';
      local_9a8.items[lVar20].group_accel = '\0';
      local_9a8.items[lVar20].selected = '\0';
      builtin_strncpy(local_9a8.items[lVar20].caption,"Has no resistanc",0x10);
      builtin_strncpy(local_9a8.items[lVar20].caption + 0x10,"es.",4);
      local_9a8.icount = local_9a8.icount + 1;
    }
    else {
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = '.';
      (local_948 + sVar14)[1] = '\0';
      add_menutext_wrapped(&local_9a8,(int)local_948,text_00);
    }
    if ((uVar2 & 0x10) != 0) {
      lVar20 = (long)local_9a8.size;
      if (local_9a8.size <= local_9a8.icount) {
        local_9a8.size = local_9a8.size * 2;
        local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_9a8.icount;
      local_9a8.items[lVar20].id = 0;
      local_9a8.items[lVar20].role = MI_TEXT;
      local_9a8.items[lVar20].accel = '\0';
      local_9a8.items[lVar20].group_accel = '\0';
      local_9a8.items[lVar20].selected = '\0';
      builtin_strncpy(local_9a8.items[lVar20].caption,"Leaves no corpse",0x10);
      local_9a8.items[lVar20].caption[0x10] = '.';
      local_9a8.items[lVar20].caption[0x11] = '\0';
      goto LAB_0020e303;
    }
    builtin_strncpy(local_948,"Corpse c",8);
    uStack_940._0_1_ = 'o';
    uStack_940._1_1_ = 'n';
    uStack_940._2_1_ = 'v';
    uStack_940._3_1_ = 'e';
    uStack_940._4_1_ = 'y';
    uStack_940._5_1_ = 's';
    uStack_940._6_1_ = ' ';
    uStack_940._7_1_ = '\0';
    iVar9 = mondesc_resist_flags_to_str(local_948,ppVar23->mconveys);
    if (iVar9 == 0) {
      lVar20 = (long)local_9a8.size;
      if (local_9a8.size <= local_9a8.icount) {
        local_9a8.size = local_9a8.size * 2;
        local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
      }
      lVar20 = (long)local_9a8.icount;
      local_9a8.items[lVar20].id = 0;
      local_9a8.items[lVar20].role = MI_TEXT;
      local_9a8.items[lVar20].accel = '\0';
      local_9a8.items[lVar20].group_accel = '\0';
      local_9a8.items[lVar20].selected = '\0';
      builtin_strncpy(local_9a8.items[lVar20].caption,"Corpse conveys n",0x10);
      builtin_strncpy(local_9a8.items[lVar20].caption + 0xf,"no resistances.",0x10);
      goto LAB_0020e303;
    }
    sVar14 = strlen(local_948);
    builtin_strncpy(local_948 + sVar14," resistance.",0xd);
    add_menutext_wrapped(&local_9a8,(int)local_948,text_01);
  }
  else {
    lVar20 = (long)local_9a8.size;
    if (local_9a8.size <= local_9a8.icount) {
      local_9a8.size = local_9a8.size * 2;
      local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
    }
    lVar20 = (long)local_9a8.icount;
    local_9a8.items[lVar20].id = 0;
    local_9a8.items[lVar20].role = MI_TEXT;
    local_9a8.items[lVar20].accel = '\0';
    local_9a8.items[lVar20].group_accel = '\0';
    local_9a8.items[lVar20].selected = '\0';
    builtin_strncpy(local_9a8.items[lVar20].caption,"Resistances unkn",0x10);
    builtin_strncpy(local_9a8.items[lVar20].caption + 0xd,"nknown.",8);
    local_9a8.icount = local_9a8.icount + 1;
    lVar20 = (long)local_9a8.size;
    if (local_9a8.size <= local_9a8.icount) {
      local_9a8.size = local_9a8.size * 2;
      local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
    }
    lVar20 = (long)local_9a8.icount;
    local_9a8.items[lVar20].id = 0;
    local_9a8.items[lVar20].role = MI_TEXT;
    local_9a8.items[lVar20].accel = '\0';
    local_9a8.items[lVar20].group_accel = '\0';
    local_9a8.items[lVar20].selected = '\0';
    builtin_strncpy(local_9a8.items[lVar20].caption,"Corpse conveys u",0x10);
    builtin_strncpy(local_9a8.items[lVar20].caption + 0x10,"nknown resistanc",0x10);
    builtin_strncpy(local_9a8.items[lVar20].caption + 0x20,"es.",4);
LAB_0020e303:
    local_9a8.icount = local_9a8.icount + 1;
  }
  memset(local_948,0,0x100);
  memset(&local_738,0,0x100);
  memset(local_638,0,0x100);
  memset(local_338,0,0x100);
  memset(local_438,0,0x100);
  bVar22 = ppVar23->msize;
  uVar26 = (ulong)bVar22;
  uVar25 = (uint)bVar22;
  if ((uVar26 < 5) && ((0x1bU >> (uVar25 & 0x1f) & 1) != 0)) {
    pcVar13 = &DAT_002c1ea4 + *(int *)(&DAT_002c1ea4 + uVar26 * 4);
  }
  else {
    pcVar13 = "";
    if (uVar25 == 7) {
      pcVar13 = "gigantic";
    }
  }
  strcpy((char *)&local_738,pcVar13);
  if ((char)local_738 == '\0') {
    if (uVar26 == 0) {
      local_734 = 0x6c;
      local_738 = 0x6c616d73;
    }
    else if (bVar22 < 4) {
      if (uVar25 == 3) {
        local_738 = 0x676962;
      }
    }
    else {
      local_734 = local_734 & 0xff00;
      local_738 = 0x65677568;
    }
  }
  bVar27 = (uVar2 & 0x20) == 0;
  local_978 = (ulong)uVar11;
  local_950 = uVar12;
  if (bVar27) {
    pcVar13 = eos((char *)local_638);
    sprintf(pcVar13,"%s%s","","ungenocidable");
  }
  uVar11 = ppVar23->mflags1;
  iVar9 = appendc((char *)local_638,(byte)(uVar11 >> 10) & 1,"breathless",(uint)bVar27);
  iVar9 = appendc((char *)local_638,(uVar11 & 0x600) != 0,"amphibious",iVar9);
  bVar16 = (byte)uVar11;
  iVar9 = appendc((char *)local_638,bVar16 >> 3 & 1,"phasing",iVar9);
  iVar9 = appendc((char *)local_638,bVar16 >> 2 & 1,"amorphous",iVar9);
  bVar22 = ppVar23->mlet;
  iVar9 = appendc((char *)local_638,bVar22 == 0x36,"noncorporeal",iVar9);
  iVar9 = appendc((char *)local_638,(byte)(uVar11 >> 0x14) & 1,"unsolid",iVar9);
  bVar4 = (byte)(uVar11 >> 0x18);
  iVar9 = appendc((char *)local_638,bVar4 >> 3 & 1,"acidic",iVar9);
  bVar6 = is_unknown_dragon(ppVar23);
  if (bVar6 == '\0') {
    iVar9 = appendc((char *)local_638,bVar4 >> 4 & 1,"poisonous",iVar9);
  }
  iVar9 = appendc((char *)local_638,(byte)(uVar11 >> 0x17) & 1,"regenerating",iVar9);
  iVar9 = appendc((char *)local_638,bVar4 >> 1 & 1,"teleporting",iVar9);
  ppVar23 = local_988;
  uVar12 = (uint)local_978;
  local_954 = uVar12 & 0x7ffffffd;
  bVar27 = true;
  uVar25 = (uint)bVar22;
  if ((uVar12 != 0x145 && local_954 != 0x144) && ((0xfffffffd < uVar12 - 0xff || (bVar22 != 0x34))))
  {
    bVar27 = bVar22 == 0x2e;
  }
  iVar9 = appendc((char *)local_638,bVar27,"reviving",iVar9);
  iVar9 = appendc((char *)local_638,(int)local_978 == 0x7b || (int)local_978 == 0x9e,"invisible",
                  iVar9);
  if ((((bVar22 == 0x37) || ((ppVar23->mflags2 & 2) != 0)) || ((int)local_978 == 0x33)) ||
     (bVar22 == 0x16)) {
    bVar27 = (ppVar23->mflags2 & 2) == 0;
  }
  else {
    bVar27 = false;
  }
  uVar12 = appendc((char *)local_638,bVar27,"nonliving",iVar9);
  local_970 = ppVar23->mflags2;
  if ((local_970 & 2) != 0) {
    pcVar13 = eos(local_338);
    sprintf(pcVar13,"%s%s","");
  }
  bVar27 = (uVar11 >> 8 & 1) != 0;
  if (bVar27) {
    pcVar13 = eos(local_438);
    sprintf(pcVar13,"%s%s","","hider");
  }
  iVar9 = appendc(local_438,bVar16 >> 1 & 1,"swimmer",(uint)bVar27);
  iVar9 = appendc(local_438,bVar16 & 1,"flyer",iVar9);
  iVar9 = appendc(local_438,uVar25 == 5,"floater",iVar9);
  iVar10 = appendc(local_438,bVar16 >> 4 & 1,"clinger",iVar9);
  iVar9 = (int)local_978;
  if ((uVar11 & 0x20) != 0) {
    pcVar13 = eos(local_438);
    pcVar19 = ", ";
    if (iVar10 == 0) {
      pcVar19 = "";
    }
    iVar9 = (int)local_978;
    sprintf(pcVar13,"%s%s",pcVar19);
  }
  if ((char)local_738 != '\0') {
    if (((int)uVar12 < 2) && (local_438[0] != '\0' || local_338[0] != '\0')) {
LAB_0020e7fb:
      strcat(local_948,(char *)&local_738);
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = ' ';
      (local_948 + sVar14)[1] = '\0';
    }
    else if ((int)uVar12 < 1) {
      if (uVar12 == 0) goto LAB_0020e7fb;
      impossible("mondesc_flags(): impossible adjnum (%d)",(ulong)uVar12);
    }
    else {
      strcat(local_948,(char *)&local_738);
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = ',';
      (local_948 + sVar14)[1] = ' ';
      local_948[sVar14 + 2] = '\0';
    }
  }
  if (local_638[0].aatyp != '\0') {
    strcat(local_948,(char *)local_638);
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = '\0';
  }
  if (local_338[0] != '\0') {
    strcat(local_948,local_338);
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = '\0';
  }
  if (local_438[0] != '\0') {
    strcat(local_948,local_438);
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = '\0';
  }
  if (local_948[0] != '\0') {
    upstart(local_948);
    pcVar13 = eos(local_948);
    pcVar13[-1] = '.';
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = ' ';
    (local_948 + sVar14)[1] = ' ';
    local_948[sVar14 + 2] = '\0';
  }
  bVar27 = (uVar11 >> 0x18 & 1) != 0;
  if (bVar27) {
    pcVar13 = eos(local_948);
    sprintf(pcVar13,"%s%s","","Sees invisible");
  }
  iVar10 = appendp(local_948,bVar4 >> 2 & 1,"Has teleport control",(uint)bVar27);
  iVar10 = appendp(local_948,(local_970 & (int)urace.selfmask) != 0,"Is the same race as you",iVar10
                  );
  iVar10 = appendp(local_948,iVar9 - 0xbU < 2,"Petrifies by touch",iVar10);
  iVar10 = appendp(local_948,iVar9 == 0xdb,"Disintegrates by touch",iVar10);
  if ((local_950 & 0x10) == 0) {
    if (((0x20 < uVar25) || ((0x102400404U >> ((ulong)uVar25 & 0x3f) & 1) == 0)) &&
       ((iVar9 == 0x9e || (bVar22 != 0x1f)))) {
      if ((uVar25 != 0x36) && (local_954 == 0x104 || uVar25 != 0x37)) {
        if ((iVar9 != 0xd6) && (bVar22 == 0x2a)) {
          iVar10 = appendp(local_948,'\x01',"May be eaten by vegetarians",iVar10);
        }
        goto LAB_0020e9f7;
      }
    }
    pcVar13 = eos(local_948);
    pcVar19 = ".  ";
    if (iVar10 == 0) {
      pcVar19 = "";
    }
    sprintf(pcVar13,"%s%s",pcVar19,"May be eaten by vegans");
    iVar10 = iVar10 + 1;
  }
LAB_0020e9f7:
  pcVar13 = eos(local_948);
  pcVar19 = ".  ";
  if (iVar10 == 0) {
    pcVar19 = "";
  }
  pcVar24 = "Is not a valid polymorph form";
  if ((local_970 & 1) == 0) {
    pcVar24 = "Is a valid polymorph form";
  }
  sprintf(pcVar13,"%s%s",pcVar19,pcVar24);
  bVar6 = ignores_scary(local_988);
  appendp(local_948,bVar6,"Ignores Elbereth engravings and dropped scare monster scrolls",iVar10 + 1
         );
  if (local_948[0] != '\0') {
    sVar14 = strlen(local_948);
    (local_948 + sVar14)[0] = '.';
    (local_948 + sVar14)[1] = '\0';
    add_menutext_wrapped(&local_9a8,(int)local_948,text_02);
  }
  memset((void *)((long)&uStack_940 + 2),0,0xf6);
  builtin_strncpy(local_948,"Attacks:",8);
  uStack_940 = CONCAT62(uStack_940._2_6_,0x20);
  lVar20 = 0;
  do {
    (&local_738)[lVar20] = 1;
    paVar15 = getmattk(local_988,(int)lVar20,&local_738,local_638);
    aVar3 = *paVar15;
    mondesc_one_attack_buf = '\0';
    uVar7 = aVar3.damn;
    if ((0xffffff < (uint)aVar3) || ((uVar7 != '\0' || aVar3.aatyp != '\0') || aVar3.adtyp != '\0'))
    {
      uVar11 = (int)aVar3 + 2;
      if (((byte)uVar11 < 0x13) && ((0x7f3ffU >> (uVar11 & 0x1f) & 1) != 0)) {
        pcVar13 = &DAT_002c1eb8 + *(int *)(&DAT_002c1eb8 + (ulong)(uVar11 & 0xff) * 4);
      }
      else {
        impossible("mondesc_attack_type(): invalid attack type (%d)",(ulong)((uint)aVar3 & 0xff));
        pcVar13 = "???";
      }
      strcpy(&mondesc_one_attack_buf,pcVar13);
      pdVar21 = local_990;
      if (0xffffff < (uint)aVar3 || uVar7 != '\0') {
        sVar14 = strlen(&mondesc_one_attack_buf);
        *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
        if (uVar7 == '\0') {
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined8 *)(&mondesc_one_attack_buf + sVar14) = 0x312b6c6576656c28;
          *(undefined2 *)(&DAT_0035b3d8 + sVar14) = 0x29;
        }
        else {
          pcVar13 = eos(&mondesc_one_attack_buf);
          sprintf(pcVar13,"%d",(ulong)((uint)aVar3 >> 0x10 & 0xff));
        }
        pcVar13 = eos(&mondesc_one_attack_buf);
        sprintf(pcVar13,"d%d",(ulong)((uint)aVar3 >> 0x18));
      }
      if ((aVar3.aatyp == '\f') && (bVar6 = is_unknown_dragon(local_988), bVar6 != '\0')) {
        sVar14 = strlen(&mondesc_one_attack_buf);
        *(undefined8 *)(&mondesc_one_attack_buf + sVar14) = 0x6e776f6e6b6e7520;
        (&DAT_0035b3d8)[sVar14] = 0;
      }
      else {
        uVar11 = (uint)aVar3 >> 8 & 0xff;
        if (uVar11 < 0xf0) {
          pcVar13 = "";
          switch(uVar11) {
          case 0:
            break;
          case 1:
            pcVar13 = "magic missile";
            break;
          case 2:
            pcVar13 = "fire";
            break;
          case 3:
            pcVar13 = "cold";
            break;
          case 4:
            pcVar13 = "sleep";
            break;
          case 5:
            pcVar13 = "disintegration";
            break;
          case 6:
            pcVar13 = "shock";
            break;
          case 7:
            pcVar13 = "poison";
            break;
          case 8:
            pcVar13 = "acid";
            break;
          case 9:
            pcVar13 = "buzz1";
            break;
          case 10:
            pcVar13 = "buzz2";
            break;
          case 0xb:
            pcVar13 = "blind";
            break;
          case 0xc:
            pcVar13 = "stun";
            break;
          case 0xd:
            pcVar13 = "slow";
            break;
          case 0xe:
            pcVar13 = "paralysis";
            break;
          case 0xf:
            pcVar13 = "drain life";
            break;
          case 0x10:
            pcVar13 = "drain energy";
            break;
          case 0x11:
            pcVar13 = "wound legs";
            break;
          case 0x12:
            pcVar13 = "petrification";
            break;
          case 0x13:
            pcVar13 = "sticky";
            break;
          case 0x14:
            pcVar13 = "steal gold";
            break;
          case 0x15:
            pcVar13 = "steal item";
            break;
          case 0x16:
            pcVar13 = "seduce (steal items)";
            break;
          case 0x17:
            pcVar13 = "teleport";
            break;
          case 0x18:
            pcVar13 = "erosion";
            break;
          case 0x19:
            pcVar13 = "confusion";
            break;
          case 0x1a:
            pcVar13 = "digest";
            break;
          case 0x1b:
            pcVar13 = "heal";
            break;
          case 0x1c:
            pcVar13 = "drowning";
            break;
          case 0x1d:
            pcVar13 = "lycanthropy";
            break;
          case 0x1e:
            pcVar13 = "poison (dexterity)";
            break;
          case 0x1f:
            pcVar13 = "poison (constitution)";
            break;
          case 0x20:
            pcVar13 = "drain intelligence";
            break;
          case 0x21:
            pcVar13 = "disease";
            break;
          case 0x22:
            pcVar13 = "decays organic items";
            break;
          case 0x23:
            pcVar13 = "seduce";
            break;
          case 0x24:
            pcVar13 = "hallucinate";
            break;
          case 0x25:
            pcVar13 = "death";
            break;
          case 0x26:
            pcVar13 = "plus disease";
            break;
          case 0x27:
            pcVar13 = "plus hunger";
            break;
          case 0x28:
            pcVar13 = "sliming";
            break;
          case 0x29:
            pcVar13 = "disenchant";
            break;
          case 0x2a:
            pcVar13 = "corrosion";
            break;
          default:
switchD_0020ec62_caseD_2b:
            impossible("mondesc_damage_type(): invalid damage type (%d)",
                       (ulong)((uint)aVar3 >> 8 & 0xff));
            pcVar13 = "???";
            break;
          case 0x32:
            pcVar13 = "beheading";
          }
        }
        else if (uVar11 < 0xf2) {
          if (uVar11 == 0xf0) {
            pcVar13 = "(clerical)";
          }
          else {
            pcVar13 = "";
            if (uVar11 != 0xf1) goto switchD_0020ec62_caseD_2b;
          }
        }
        else if (uVar11 == 0xf2) {
          pcVar13 = "random";
        }
        else if (uVar11 == 0xfc) {
          pcVar13 = "artifact stealing";
        }
        else {
          if (uVar11 != 0xfd) goto switchD_0020ec62_caseD_2b;
          pcVar13 = "steal intrinsic";
        }
        if (*pcVar13 != '\0') {
          sVar14 = strlen(&mondesc_one_attack_buf);
          *(undefined2 *)(&mondesc_one_attack_buf + sVar14) = 0x20;
          strcat(&mondesc_one_attack_buf,pcVar13);
        }
      }
    }
    if (mondesc_one_attack_buf == '\0') {
      if (lVar20 == 0) {
        sVar14 = strlen(local_948);
        builtin_strncpy(local_948 + sVar14,"none",5);
      }
      break;
    }
    if (lVar20 != 0) {
      sVar14 = strlen(local_948);
      (local_948 + sVar14)[0] = ',';
      (local_948 + sVar14)[1] = ' ';
      local_948[sVar14 + 2] = '\0';
    }
    strcat(local_948,&mondesc_one_attack_buf);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 6);
  sVar14 = strlen(local_948);
  (local_948 + sVar14)[0] = '.';
  (local_948 + sVar14)[1] = '\0';
  add_menutext_wrapped(&local_9a8,(int)local_948,text_03);
LAB_0020ef70:
  pcVar13 = local_968;
  if ((char)local_994 == '\0') {
    if (((char)local_97c != '\0') && (local_9a8.icount == 0)) {
      pline("I don\'t have any information on those things.");
    }
  }
  else {
    do {
      pcVar19 = dlb_fgets(local_838,0x100,pdVar21);
      if (pcVar19 == (char *)0x0) goto LAB_0020efd2;
      bVar6 = digit(local_838[0]);
    } while (bVar6 == '\0');
    iVar9 = __isoc99_sscanf(local_838,"%ld,%d\n",&local_840);
    if (iVar9 < 2) {
LAB_0020efd2:
      impossible("\'data\' file in wrong format");
      goto LAB_0020f029;
    }
    if (((char)local_94c != '\0' || (char)local_97c != '\0') ||
       (cVar8 = yn_function("More info?","yn",'n'), cVar8 == 'y')) {
      iVar9 = dlb_fseek(pdVar21,local_840 + local_960,0);
      if (iVar9 < 0) {
        pline("? Seek error on \'data\' file!");
        goto LAB_0020f029;
      }
      if (local_9a8.icount != 0) {
        lVar20 = (long)local_9a8.size;
        if (local_9a8.size <= local_9a8.icount) {
          local_9a8.size = local_9a8.size * 2;
          local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
        }
        lVar20 = (long)local_9a8.icount;
        local_9a8.items[lVar20].accel = '\0';
        local_9a8.items[lVar20].group_accel = '\0';
        local_9a8.items[lVar20].selected = '\0';
        local_9a8.items[lVar20].caption[0] = '\0';
        local_9a8.items[lVar20].id = 0;
        local_9a8.items[lVar20].role = MI_TEXT;
        local_9a8.icount = local_9a8.icount + 1;
      }
      if (0 < local_96c) {
        iVar9 = 0;
        pcVar19 = local_838 + 1;
        do {
          pcVar24 = dlb_fgets(local_838,0x100,pdVar21);
          if (pcVar24 == (char *)0x0) goto LAB_0020efd2;
          pcVar24 = strchr(local_838,10);
          if (pcVar24 != (char *)0x0) {
            *pcVar24 = '\0';
          }
          pcVar24 = strchr(pcVar19,9);
          if (pcVar24 != (char *)0x0) {
            tabexpand(pcVar19);
          }
          lVar20 = (long)local_9a8.size;
          if (local_9a8.size <= local_9a8.icount) {
            local_9a8.size = local_9a8.size * 2;
            local_9a8.items = (nh_menuitem *)realloc(local_9a8.items,lVar20 * 0x218);
          }
          pnVar1 = local_9a8.items + local_9a8.icount;
          pnVar1->id = 0;
          pnVar1->role = MI_TEXT;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,pcVar19);
          local_9a8.icount = local_9a8.icount + 1;
          iVar9 = iVar9 + 1;
        } while (iVar9 < local_96c);
      }
    }
  }
  iVar9 = local_9a8.icount;
  pnVar1 = local_9a8.items;
  if (local_9a8.icount != 0) {
    pcVar13 = upstart(pcVar13);
    display_menu(pnVar1,iVar9,pcVar13,0,(int *)0x0);
  }
LAB_0020f029:
  free(local_9a8.items);
  dlb_fclose(pdVar21);
  return;
}

Assistant:

static void checkfile(const char *inp, struct permonst *pm, boolean user_typed_name,
		      boolean without_asking)
{
    dlb *fp;
    char buf[BUFSZ], newstr[BUFSZ];
    char *ep, *dbase_str;
    long txt_offset;
    int chk_skip;
    boolean found_in_file = FALSE, skipping_entry = FALSE;
    int mntmp;
    char mnname[BUFSZ];
    struct menulist menu;

    fp = dlb_fopen(DATAFILE, "r");
    if (!fp) {
	pline("Cannot open data file!");
	return;
    }

    if (user_typed_name)
	pline("Looking up \"%s\"...", inp);

    /* To prevent the need for entries in data.base like *ngel to account
     * for Angel and angel, make the lookup string the same for both
     * user_typed_name and picked name.
     */
    if (pm != NULL && !user_typed_name)
	dbase_str = strcpy(newstr, mons_mname(pm));
    else dbase_str = strcpy(newstr, inp);
    lcase(dbase_str);

    if (!strncmp(dbase_str, "interior of ", 12))
	dbase_str += 12;
    if (!strncmp(dbase_str, "a ", 2))
	dbase_str += 2;
    else if (!strncmp(dbase_str, "an ", 3))
	dbase_str += 3;
    else if (!strncmp(dbase_str, "the ", 4))
	dbase_str += 4;
    if (!strncmp(dbase_str, "tame ", 5))
	dbase_str += 5;
    else if (!strncmp(dbase_str, "peaceful ", 9))
	dbase_str += 9;
    if (!strncmp(dbase_str, "invisible ", 10))
	dbase_str += 10;
    if (!strncmp(dbase_str, "statue of ", 10))
	dbase_str[6] = '\0';
    else if (!strncmp(dbase_str, "figurine of ", 12))
	dbase_str[8] = '\0';

    /* Make sure the name is non-empty. */
    if (*dbase_str) {
	/* adjust the input to remove " [seen" and "named " and convert to lower case */
	char *alt = 0;	/* alternate description */

	if ((ep = strstri(dbase_str, " [seen")) != 0 ||
	    (ep = strstri(dbase_str, " and more")) != 0)
	    *ep = '\0';

	if ((ep = strstri(dbase_str, " named ")) != 0)
	    alt = ep + 7;
	else
	    ep = strstri(dbase_str, " called ");
	if (!ep) ep = strstri(dbase_str, ", ");
	if (ep && ep > dbase_str) *ep = '\0';

	/*
	 * If the object is named, then the name is the alternate description;
	 * otherwise, the result of makesingular() applied to the name is. This
	 * isn't strictly optimal, but named objects of interest to the user
	 * will usually be found under their name, rather than under their
	 * object type, so looking for a singular form is pointless.
	 */

	if (!alt)
	    alt = makesingular(dbase_str);
	else
	    if (user_typed_name)
		lcase(alt);

	/* skip first record; read second */
	txt_offset = 0L;
	if (!dlb_fgets(buf, BUFSZ, fp) || !dlb_fgets(buf, BUFSZ, fp)) {
	    impossible("can't read 'data' file");
	    dlb_fclose(fp);
	    return;
	} else if (sscanf(buf, "%8lx\n", &txt_offset) < 1 || txt_offset <= 0)
	    goto bad_data_file;

	/* look for the appropriate entry */
	while (dlb_fgets(buf,BUFSZ,fp)) {
	    if (*buf == '.') break;  /* we passed last entry without success */

	    if (digit(*buf)) {
		/* a number indicates the end of current entry */
		skipping_entry = FALSE;
	    } else if (!skipping_entry) {
		if (!(ep = strchr(buf, '\n'))) goto bad_data_file;
		*ep = 0;
		/* if we match a key that begins with "~", skip this entry */
		chk_skip = (*buf == '~') ? 1 : 0;
		if (pmatch(&buf[chk_skip], dbase_str) ||
			(alt && pmatch(&buf[chk_skip], alt))) {
		    if (chk_skip) {
			skipping_entry = TRUE;
			continue;
		    } else {
			found_in_file = TRUE;
			break;
		    }
		}
	    }
	}
    }

    init_menulist(&menu);

    mntmp = name_to_mon(dbase_str);
    if (mntmp >= LOW_PM) {
	strcpy(mnname, mons_mname(&mons[mntmp]));
	lcase(mnname);
	if (!strcmp(dbase_str, mnname)) {
	    dbase_str = strcpy(newstr, mons_mname(&mons[mntmp]));
	    mondesc_all(&menu, &mons[mntmp]);
	}
    }

    if (found_in_file) {
	long entry_offset;
	int  entry_count;
	int  i;

	/* skip over other possible matches for the info */
	do {
	    if (!dlb_fgets(buf, BUFSZ, fp))
		goto bad_data_file;
	} while (!digit(*buf));
	
	if (sscanf(buf, "%ld,%d\n", &entry_offset, &entry_count) < 2) {
bad_data_file:	impossible("'data' file in wrong format");
		free(menu.items);
		dlb_fclose(fp);
		return;
	}

	if (user_typed_name || without_asking || yn("More info?") == 'y') {

	    if (dlb_fseek(fp, txt_offset + entry_offset, SEEK_SET) < 0) {
		pline("? Seek error on 'data' file!");
		free(menu.items);
		dlb_fclose(fp);
		return;
	    }

	    if (menu.icount)
		add_menutext(&menu, "");

	    for (i = 0; i < entry_count; i++) {
		if (!dlb_fgets(buf, BUFSZ, fp))
		    goto bad_data_file;
		if ((ep = strchr(buf, '\n')) != 0)
		    *ep = 0;
		if (strchr(buf+1, '\t') != 0)
		    tabexpand(buf+1);
		add_menutext(&menu, buf+1);
	    }
	}
    } else if (user_typed_name && !menu.icount) {
	pline("I don't have any information on those things.");
    }

    if (menu.icount)
	display_menu(menu.items, menu.icount, upstart(dbase_str), FALSE, NULL);
    free(menu.items);

    dlb_fclose(fp);
}